

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::UnitTest::RecordPropertyForCurrentTest(UnitTest *this,char *key,char *value)

{
  TestResult *this_00;
  undefined1 local_40 [8];
  TestProperty test_property;
  char *value_local;
  char *key_local;
  UnitTest *this_local;
  
  test_property.value_.length_ = (size_t)value;
  TestProperty::TestProperty((TestProperty *)local_40,key,value);
  this_00 = internal::UnitTestImpl::current_test_result(this->impl_);
  TestResult::RecordProperty(this_00,(TestProperty *)local_40);
  TestProperty::~TestProperty((TestProperty *)local_40);
  return;
}

Assistant:

void UnitTest::RecordPropertyForCurrentTest(const char* key,
                                            const char* value) {
  const TestProperty test_property(key, value);
  impl_->current_test_result()->RecordProperty(test_property);
}